

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

uint __thiscall
ON_ComponentManifestImpl::DeletedItemCountImpl(ON_ComponentManifestImpl *this,Type component_type)

{
  bool bVar1;
  Type component_type_00;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ON_ModelComponentTypeIterator type_it;
  ON_ModelComponentTypeIterator local_48;
  
  bVar1 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type);
  if (bVar1) {
    if (component_type < NumOf) {
      lVar3 = (long)&this->m_table_index[0].m_manifest_table_sn +
              (ulong)((uint)component_type * 0x50);
    }
    else {
      lVar3 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                 ,0xebb,"","component_type is not valid");
    }
    if (lVar3 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(uint *)(lVar3 + 0x10);
    }
  }
  else {
    local_48.m_types[0x18] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x18];
    local_48.m_types[0x19] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x19];
    local_48.m_types[0x1a] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x1a];
    local_48.m_types[0x1b] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x1b];
    local_48.m_types[0x1c] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x1c];
    local_48.m_types[0x1d] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x1d];
    local_48.m_types[0x1e] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x1e];
    local_48.m_types[0x1f] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x1f];
    local_48.m_types[8] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[8];
    local_48.m_types[9] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[9];
    local_48.m_types[10] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[10];
    local_48.m_types[0xb] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0xb];
    local_48.m_types[0xc] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0xc];
    local_48.m_types[0xd] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0xd];
    local_48.m_types[0xe] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0xe];
    local_48.m_types[0xf] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0xf];
    local_48.m_types[0x10] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x10];
    local_48.m_types[0x11] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x11];
    local_48.m_types[0x12] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x12];
    local_48.m_types[0x13] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x13];
    local_48.m_types[0x14] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x14];
    local_48.m_types[0x15] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x15];
    local_48.m_types[0x16] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x16];
    local_48.m_types[0x17] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0x17];
    local_48.m_type_count = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_type_count;
    local_48.m_current_index = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_current_index
    ;
    local_48.m_types[0] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[0];
    local_48.m_types[1] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[1];
    local_48.m_types[2] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[2];
    local_48.m_types[3] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[3];
    local_48.m_types[4] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[4];
    local_48.m_types[5] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[5];
    local_48.m_types[6] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[6];
    local_48.m_types[7] = ON_ModelComponentTypeIterator::ExplicitComponentTypes.m_types[7];
    component_type_00 = ON_ModelComponentTypeIterator::FirstType(&local_48);
    uVar4 = 0;
    while (component_type_00 != Unset) {
      bVar1 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type_00);
      if (bVar1) {
        uVar2 = DeletedItemCountImpl(this,component_type_00);
        uVar4 = uVar4 + uVar2;
      }
      component_type_00 = ON_ModelComponentTypeIterator::NextType(&local_48);
    }
  }
  return uVar4;
}

Assistant:

unsigned int ON_ComponentManifestImpl::DeletedItemCountImpl(
  ON_ModelComponent::Type component_type
  ) const
{
  unsigned int count = 0;
  if (ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type))
  {
    const ON_ComponentManifestTableIndex* table_index = TableIndexFromTypeConst(component_type);
    count
      = (nullptr == table_index) 
      ? 0
      : table_index->DeletedItemCount();
  }
  else
  {
    ON_ModelComponentTypeIterator type_it = ON_ModelComponentTypeIterator::ExplicitComponentTypes;
    for (ON_ModelComponent::Type t = type_it.FirstType(); ON_ModelComponent::Type::Unset != t; t = type_it.NextType())
    {
      if (ON_ModelComponent::ComponentTypeIsValidAndNotMixed(t))
       count += DeletedItemCountImpl(t);
    }
  }
  return count;
}